

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

char * la_strsep(char **sp,char *sep)

{
  size_t sVar1;
  char *pcVar2;
  char *s;
  char *p;
  char *sep_local;
  char **sp_local;
  
  if (((sp == (char **)0x0) || (*sp == (char *)0x0)) || (**sp == '\0')) {
    sp_local = (char **)0x0;
  }
  else {
    sp_local = (char **)*sp;
    sVar1 = strcspn((char *)sp_local,sep);
    pcVar2 = (char *)((long)sp_local + sVar1);
    s = pcVar2;
    if (*pcVar2 != '\0') {
      s = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    *sp = s;
  }
  return (char *)sp_local;
}

Assistant:

static char *
la_strsep(char **sp, const char *sep)
{
	char *p, *s;
	if (sp == NULL || *sp == NULL || **sp == '\0')
		return(NULL);
	s = *sp;
	p = s + strcspn(s, sep);
	if (*p != '\0')
		*p++ = '\0';
	*sp = p;
	return(s);
}